

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjExporter.h
# Opt level: O2

bool __thiscall
Assimp::ObjExporter::aiVectorCompare::operator()(aiVectorCompare *this,aiVector3D *a,aiVector3D *b)

{
  bool bVar1;
  
  bVar1 = true;
  if (b->x <= a->x) {
    if (a->x <= b->x) {
      if (a->y < b->y) {
        return true;
      }
      if (a->y <= b->y) {
        return a->z <= b->z && b->z != a->z;
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool operator() (const aiVector3D& a, const aiVector3D& b) const { 
            if(a.x < b.x) return true; 
            if(a.x > b.x) return false; 
            if(a.y < b.y) return true; 
            if(a.y > b.y) return false; 
            if(a.z < b.z) return true; 
            return false;
        }